

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

NetParameter * __thiscall caffe::SolverParameter::mutable_train_net_param(SolverParameter *this)

{
  NetParameter *this_00;
  SolverParameter *this_local;
  
  set_has_train_net_param(this);
  if (this->train_net_param_ == (NetParameter *)0x0) {
    this_00 = (NetParameter *)operator_new(0xa0);
    NetParameter::NetParameter(this_00);
    this->train_net_param_ = this_00;
  }
  return this->train_net_param_;
}

Assistant:

inline ::caffe::NetParameter* SolverParameter::mutable_train_net_param() {
  set_has_train_net_param();
  if (train_net_param_ == NULL) {
    train_net_param_ = new ::caffe::NetParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.SolverParameter.train_net_param)
  return train_net_param_;
}